

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O2

void __thiscall
ft::treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>::transplant
          (treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_> *this,node *u,node *v)

{
  treeNode<int> *ptVar1;
  
  if ((this->m_tree).m_root == u) {
    (this->m_tree).m_root = v;
    ptVar1 = u->parent;
  }
  else {
    ptVar1 = u->parent;
    if (ptVar1->left == u) {
      ptVar1->left = v;
    }
    else if (ptVar1->right == u) {
      ptVar1->right = v;
    }
  }
  v->parent = ptVar1;
  return;
}

Assistant:

void	transplant(node* u, node* v)
	{
		if (u == this->root())
			this->m_tree.m_root = v;
		else if (u == u->parent->left)
			u->parent->left = v;
		else if (u == u->parent->right)
			u->parent->right = v;
		v->parent = u->parent;
	}